

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pattern.h
# Opt level: O2

double ZXing::IsPattern<true,5,7>
                 (PatternView *view,FixedPattern<5,_7,_false> *pattern,int spaceInPixel,
                 double minQuietZone,double moduleSizeRef)

{
  double *pdVar1;
  BarAndSpace<unsigned_short> BVar2;
  int x;
  long lVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  BarAndSpace<double> BVar11;
  BarAndSpace<double> thr;
  double local_58 [4];
  double local_38;
  undefined1 local_28 [16];
  
  BVar11 = BarAndSpaceSum<5,double,unsigned_short>(view->_data);
  local_38 = BVar11.space;
  local_58[2] = BVar11.bar;
  BVar2 = BarAndSpaceSum<5,unsigned_short,unsigned_short>(pattern->_data);
  auVar5._0_8_ = (double)((uint)BVar2 & 0xffff);
  auVar5._8_8_ = (double)((uint)BVar2 >> 0x10);
  auVar9._8_8_ = local_38;
  auVar9._0_8_ = local_58[2];
  local_28 = divpd(auVar9,auVar5);
  dVar8 = local_28._0_8_;
  dVar10 = local_28._8_8_;
  dVar7 = dVar10;
  if (dVar8 <= dVar10) {
    dVar7 = dVar8;
  }
  dVar6 = dVar8;
  if (dVar8 <= dVar10) {
    dVar6 = dVar10;
  }
  if ((dVar6 <= dVar7 * 4.0) &&
     (((minQuietZone == 0.0 && (!NAN(minQuietZone))) ||
      (minQuietZone * dVar10 <= (double)spaceInPixel)))) {
    local_58[0] = dVar8 * 0.75 + 0.5;
    local_58[1] = dVar10 / 3.0 + 0.5;
    lVar3 = 0;
    do {
      if (lVar3 == 5) {
        return (dVar8 + dVar10) * 0.5;
      }
      uVar4 = (ulong)(((uint)lVar3 & 1) << 3);
      dVar7 = ABS((double)view->_data[lVar3] -
                  (double)pattern->_data[lVar3] * *(double *)(local_28 + uVar4));
      lVar3 = lVar3 + 1;
      pdVar1 = (double *)((long)local_58 + uVar4);
    } while (dVar7 < *pdVar1 || dVar7 == *pdVar1);
  }
  return 0.0;
}

Assistant:

double IsPattern(const PatternView& view, const FixedPattern<LEN, SUM, false>& pattern, int spaceInPixel = 0,
				double minQuietZone = 0, double moduleSizeRef = 0)
{
	if constexpr (E2E) {
		auto widths = BarAndSpaceSum<LEN, double>(view.data());
		auto sums = pattern.sums();
		BarAndSpace<double> modSize = {widths[0] / sums[0], widths[1] / sums[1]};

		auto [m, M] = std::minmax(modSize[0], modSize[1]);
		if (M > 4 * m) // make sure module sizes of bars and spaces are not too far away from each other
			return 0;

		if (minQuietZone && spaceInPixel < minQuietZone * modSize.space)
			return 0;

		const BarAndSpace<double> thr = {modSize[0] * .75 + .5, modSize[1] / (2 + (LEN < 6)) + .5};

		for (int x = 0; x < LEN; ++x)
			if (std::abs(view[x] - pattern[x] * modSize[x]) > thr[x])
				return 0;

		return (modSize[0] + modSize[1]) / 2;
	}

	double width = view.sum(LEN);
	if (SUM > LEN && width < SUM)
		return 0;

	const auto moduleSize = width / SUM;

	if (minQuietZone && spaceInPixel < minQuietZone * moduleSize - 1)
		return 0;

	if (!moduleSizeRef)
		moduleSizeRef = moduleSize;

	// the offset of 0.5 is to make the code less sensitive to quantization errors for small (near 1) module sizes.
	// TODO: review once we have upsampling in the binarizer in place.
	const auto threshold = moduleSizeRef * (0.5 + E2E * 0.25) + 0.5;

	for (int x = 0; x < LEN; ++x)
		if (std::abs(view[x] - pattern[x] * moduleSizeRef) > threshold)
			return 0;

	return moduleSize;
}